

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

TIntermAggregate * __thiscall glslang::TIntermediate::findLinkerObjects(TIntermediate *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long lVar3;
  TIntermAggregate *pTVar4;
  
  iVar1 = (*this->treeRoot->_vptr_TIntermNode[6])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 400))
                    ((long *)CONCAT44(extraout_var,iVar1));
  lVar3 = (**(code **)(**(long **)(*(long *)(lVar2 + 0x10) + -8) + 0x30))();
  if (*(int *)(lVar3 + 0xb8) == 3) {
    pTVar4 = (TIntermAggregate *)(**(code **)(**(long **)(*(long *)(lVar2 + 0x10) + -8) + 0x30))();
    return pTVar4;
  }
  __assert_fail("globals.back()->getAsAggregate()->getOp() == EOpLinkerObjects",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                ,0x6a2,"TIntermAggregate *glslang::TIntermediate::findLinkerObjects() const");
}

Assistant:

TIntermAggregate* TIntermediate::findLinkerObjects() const
{
    // Get the top-level globals
    TIntermSequence& globals = treeRoot->getAsAggregate()->getSequence();

    // Get the last member of the sequences, expected to be the linker-object lists
    assert(globals.back()->getAsAggregate()->getOp() == EOpLinkerObjects);

    return globals.back()->getAsAggregate();
}